

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

bool __thiscall
DynamicGraph::bdbfsStep
          (DynamicGraph *this,list<unsigned_long,_std::allocator<unsigned_long>_> *queue,
          vector<bool,_std::allocator<bool>_> *visitedV,
          vector<bool,_std::allocator<bool>_> *visitedU,
          list<unsigned_long,_std::allocator<unsigned_long>_> *visitedList)

{
  _List_node_base *__n;
  pointer psVar1;
  pointer psVar2;
  size_type sVar3;
  pointer psVar4;
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *this_00;
  reference rVar5;
  Vertex vvTarget;
  size_type local_68;
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *local_60;
  list<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  list<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  key_type local_48;
  
  __n = (queue->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl._M_node.
        super__List_node_base._M_next[1]._M_next;
  local_50 = visitedList;
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](visitedV,(size_type)__n);
  *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
  local_58 = queue;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(queue);
  psVar1 = (this->super_UndirectedGraph).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = *(pointer *)
            ((long)&psVar1[(long)__n].super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
            + 8);
  this_00 = &this->virtualEdges;
  local_60 = this_00;
  for (psVar4 = *(pointer *)
                 &psVar1[(long)__n].super_StoredVertex.m_out_edges.
                  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
      ; psVar4 != psVar2; psVar4 = psVar4 + 1) {
    local_68 = (psVar4->super_stored_edge<unsigned_long>).m_target;
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](visitedU,local_68);
    if ((*rVar5._M_p & rVar5._M_mask) != 0) break;
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](visitedV,local_68);
    if ((*rVar5._M_p & rVar5._M_mask) == 0) {
      local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           (psVar4->super_stored_edge<unsigned_long>).m_target;
      local_48.m_eproperty = (psVar4->m_iter)._M_node + 2;
      local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = (unsigned_long)__n;
      sVar3 = std::
              set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ::count(this_00,&local_48);
      if (sVar3 == 0) {
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (local_58,&local_68);
        this_00 = local_60;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (local_50,&local_68);
      }
    }
  }
  return psVar4 == psVar2;
}

Assistant:

bool DynamicGraph::bdbfsStep(std::list<Vertex>& queue, std::vector<bool>& visitedV,
               std::vector<bool>& visitedU, std::list<Vertex>& visitedList)
{
    Vertex vv = queue.front();
    visitedV[vv]=true;
    queue.pop_front();

    OutEdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = out_edges(vv, *this); ei != ei_end; ++ei) {
        Vertex vvTarget = target(*ei, *this);
        if (visitedU[vvTarget]) {
            return false;
        }
        if(!visitedV[vvTarget] && !virtualEdges.count(*ei)){
            queue.push_back(vvTarget);
            visitedList.push_back(vvTarget);
        }
    }
    return true;
}